

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O0

deSocketResult mapSendRecvResult(int numBytes)

{
  int *piVar1;
  undefined4 local_c;
  int numBytes_local;
  
  if (numBytes < 1) {
    if (numBytes == 0) {
      local_c = DE_SOCKETRESULT_CONNECTION_CLOSED;
    }
    else {
      piVar1 = __errno_location();
      if (*piVar1 == 0xb) {
        local_c = DE_SOCKETRESULT_WOULD_BLOCK;
      }
      else if (*piVar1 - 0x67U < 2) {
        local_c = DE_SOCKETRESULT_CONNECTION_TERMINATED;
      }
      else {
        local_c = DE_SOCKETRESULT_ERROR;
      }
    }
  }
  else {
    local_c = DE_SOCKETRESULT_SUCCESS;
  }
  return local_c;
}

Assistant:

static deSocketResult mapSendRecvResult (int numBytes)
{
	if (numBytes > 0)
		return DE_SOCKETRESULT_SUCCESS;
	else if (numBytes == 0)
		return DE_SOCKETRESULT_CONNECTION_CLOSED;
	else
	{
		/* Other errors. */
#if defined(DE_USE_WINSOCK)
		int	error = WSAGetLastError();
		switch (error)
		{
			case WSAEWOULDBLOCK:	return DE_SOCKETRESULT_WOULD_BLOCK;
			case WSAENETDOWN:
			case WSAENETRESET:
			case WSAECONNABORTED:
			case WSAECONNRESET:		return DE_SOCKETRESULT_CONNECTION_TERMINATED;
			default:				return DE_SOCKETRESULT_ERROR;
		}
#else
		switch (errno)
		{
			case EAGAIN:		return DE_SOCKETRESULT_WOULD_BLOCK;
			case ECONNABORTED:
			case ECONNRESET:	return DE_SOCKETRESULT_CONNECTION_TERMINATED;
			default:			return DE_SOCKETRESULT_ERROR;
		}
#endif
	}
}